

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

FState * __thiscall AActor::GetRaiseState(AActor *this)

{
  bool bVar1;
  uint uVar2;
  FName local_20;
  TFlags<ActorFlag,_unsigned_int> local_1c;
  AActor *local_18;
  AActor *this_local;
  
  local_18 = this;
  TFlags<ActorFlag,_unsigned_int>::operator&
            (&local_1c,
             (int)this +
             (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE));
  uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1c);
  if (uVar2 == 0) {
    this_local = (AActor *)0x0;
  }
  else {
    if ((this->tics != -1) && (bVar1 = FState::GetCanRaise(this->state), !bVar1)) {
      return (FState *)0x0;
    }
    bVar1 = DObject::IsKindOf((DObject *)this,APlayerPawn::RegistrationInfo.MyClass);
    if (bVar1) {
      this_local = (AActor *)0x0;
    }
    else {
      FName::FName(&local_20,NAME_Raise);
      this_local = (AActor *)FindState(this,&local_20);
    }
  }
  return (FState *)this_local;
}

Assistant:

FState *AActor::GetRaiseState()
{
	if (!(flags & MF_CORPSE))
	{
		return NULL;	// not a monster
	}

	if (tics != -1 && // not lying still yet
		!state->GetCanRaise()) // or not ready to be raised yet
	{
		return NULL;
	}

	if (IsKindOf(RUNTIME_CLASS(APlayerPawn)))
	{
		return NULL;	// do not resurrect players
	}

	return FindState(NAME_Raise);
}